

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O0

char * iptos(u_long in)

{
  short local_1c;
  u_char *p;
  u_long in_local;
  
  if (iptos::which == 0xb) {
    local_1c = 0;
  }
  else {
    local_1c = iptos::which + 1;
  }
  iptos::which = local_1c;
  p._3_1_ = (byte)(in >> 0x18);
  snprintf(iptos::output[local_1c],0x10,"%d.%d.%d.%d",in & 0xff,in >> 8 & 0xff,in >> 0x10 & 0xff,
           (uint)p._3_1_);
  return iptos::output[iptos::which];
}

Assistant:

char* iptos(u_long in)
{
    static char output[IPTOSBUFFERS][3 * 4 + 3 + 1];
    static short which;
    u_char* p;

    p = (u_char*)&in;
    which = (which + 1 == IPTOSBUFFERS ? 0 : which + 1);
    snprintf(output[which], sizeof(output[which]), "%d.%d.%d.%d", p[0], p[1], p[2], p[3]);
    return output[which];
}